

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:352:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:352:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  pointer pvVar1;
  void *pvVar2;
  value *pvVar3;
  pointer desc;
  anon_class_16_1_570cf4e1_for_f *this_00;
  object_ptr o;
  string p;
  undefined1 local_48 [16];
  gc_heap_ptr_untyped local_38;
  
  this_00 = &this->f;
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  h = *(gc_heap **)((long)pvVar2 + 8);
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  desc = (pointer)&value::undefined;
  global_object::validate_object((global_object *)local_48,pvVar3);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = pvVar1 + 1;
  if ((int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
      -0x33333333 < 2) {
    pvVar3 = (value *)&value::undefined;
  }
  to_string((mjs *)(local_48 + 0x10),h,pvVar3);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (2 < (int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
          -0x33333333) {
    desc = pvVar1 + 2;
  }
  anon_unknown_33::define_own_property_checked
            (&this_00->global,(object_ptr *)local_48,(string *)(local_48 + 0x10),desc);
  __return_storage_ptr__->type_ = object;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = (gc_heap *)local_48._0_8_;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_48._8_4_;
  if ((gc_heap *)local_48._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_48._0_8_,
                    (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_48 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_48);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }